

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool __thiscall cmGlobalGenerator::UseFolderProperty(cmGlobalGenerator *this)

{
  string_view val;
  bool bVar1;
  cmake *this_00;
  cmState *this_01;
  string *this_02;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue prop;
  cmGlobalGenerator *this_local;
  
  prop.Value = (string *)this;
  this_00 = GetCMakeInstance(this);
  this_01 = cmake::GetState(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"USE_FOLDERS",&local_41);
  local_20 = cmState::GetGlobalProperty(this_01,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = cmValue::operator_cast_to_bool(&local_20);
  if (bVar1) {
    this_02 = cmValue::operator*[abi_cxx11_(&local_20);
    val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_02);
    this_local._7_1_ = cmIsOn(val);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGenerator::UseFolderProperty() const
{
  cmValue prop =
    this->GetCMakeInstance()->GetState()->GetGlobalProperty("USE_FOLDERS");

  // If this property is defined, let the setter turn this on or off...
  //
  if (prop) {
    return cmIsOn(*prop);
  }

  // By default, this feature is OFF, since it is not supported in the
  // Visual Studio Express editions until VS11:
  //
  return false;
}